

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O2

void restore_flags(memfile *mf,flag *f)

{
  int8_t iVar1;
  uint uVar2;
  int32_t iVar3;
  
  memset(f,0,0xb0);
  uVar2 = mread32(mf);
  f->ident = uVar2;
  uVar2 = mread32(mf);
  f->moonphase = uVar2;
  uVar2 = mread32(mf);
  f->no_of_wizards = uVar2;
  iVar3 = mread32(mf);
  f->init_role = iVar3;
  iVar3 = mread32(mf);
  f->init_race = iVar3;
  iVar3 = mread32(mf);
  f->init_gend = iVar3;
  iVar3 = mread32(mf);
  f->init_align = iVar3;
  iVar3 = mread32(mf);
  f->randomall = iVar3;
  iVar3 = mread32(mf);
  f->pantheon = iVar3;
  uVar2 = mread32(mf);
  f->run = uVar2;
  uVar2 = mread32(mf);
  f->warntype = uVar2;
  iVar3 = mread32(mf);
  f->djinni_count = iVar3;
  iVar3 = mread32(mf);
  f->ghost_count = iVar3;
  iVar3 = mread32(mf);
  f->pickup_burden = iVar3;
  iVar1 = mread8(mf);
  f->autodig = iVar1;
  iVar1 = mread8(mf);
  f->autoquiver = iVar1;
  iVar1 = mread8(mf);
  f->autounlock = iVar1;
  iVar1 = mread8(mf);
  f->beginner = iVar1;
  iVar1 = mread8(mf);
  f->debug = iVar1;
  iVar1 = mread8(mf);
  f->explore = iVar1;
  iVar1 = mread8(mf);
  f->tutorial = iVar1;
  iVar1 = mread8(mf);
  f->female = iVar1;
  iVar1 = mread8(mf);
  f->forcefight = iVar1;
  iVar1 = mread8(mf);
  f->friday13 = iVar1;
  iVar1 = mread8(mf);
  f->legacy = iVar1;
  iVar1 = mread8(mf);
  f->lit_corridor = iVar1;
  iVar1 = mread8(mf);
  f->made_amulet = iVar1;
  iVar1 = mread8(mf);
  f->mon_moving = iVar1;
  iVar1 = mread8(mf);
  f->move = iVar1;
  iVar1 = mread8(mf);
  f->mv = iVar1;
  iVar1 = mread8(mf);
  f->nopick = iVar1;
  iVar1 = mread8(mf);
  f->pickup = iVar1;
  iVar1 = mread8(mf);
  f->pushweapon = iVar1;
  iVar1 = mread8(mf);
  f->rest_on_space = iVar1;
  iVar1 = mread8(mf);
  f->safe_dog = iVar1;
  iVar1 = mread8(mf);
  f->safe_peaceful = iVar1;
  iVar1 = mread8(mf);
  f->silent = iVar1;
  iVar1 = mread8(mf);
  f->sortpack = iVar1;
  iVar1 = mread8(mf);
  f->soundok = iVar1;
  iVar1 = mread8(mf);
  f->sparkle = iVar1;
  iVar1 = mread8(mf);
  f->tombstone = iVar1;
  iVar1 = mread8(mf);
  f->verbose = iVar1;
  iVar1 = mread8(mf);
  f->prayconfirm = iVar1;
  iVar1 = mread8(mf);
  f->travel = iVar1;
  iVar1 = mread8(mf);
  f->end_disclose = iVar1;
  iVar1 = mread8(mf);
  f->menu_style = iVar1;
  iVar1 = mread8(mf);
  f->elbereth_enabled = iVar1;
  iVar1 = mread8(mf);
  f->rogue_enabled = iVar1;
  iVar1 = mread8(mf);
  f->seduce_enabled = iVar1;
  iVar1 = mread8(mf);
  f->bones_enabled = iVar1;
  iVar1 = mread8(mf);
  f->ascet = iVar1;
  iVar1 = mread8(mf);
  f->atheist = iVar1;
  iVar1 = mread8(mf);
  f->blindfolded = iVar1;
  iVar1 = mread8(mf);
  f->illiterate = iVar1;
  iVar1 = mread8(mf);
  f->pacifist = iVar1;
  iVar1 = mread8(mf);
  f->nudist = iVar1;
  iVar1 = mread8(mf);
  f->vegan = iVar1;
  iVar1 = mread8(mf);
  f->vegetarian = iVar1;
  mread(mf,f->inv_order,0x12);
  mread(mf,f->spell_order,0x34);
  return;
}

Assistant:

void restore_flags(struct memfile *mf, struct flag *f)
{
	memset(f, 0, sizeof(struct flag));
	
	f->ident = mread32(mf);
	f->moonphase = mread32(mf);
	f->no_of_wizards = mread32(mf);
	f->init_role = mread32(mf);
	f->init_race = mread32(mf);
	f->init_gend = mread32(mf);
	f->init_align = mread32(mf);
	f->randomall = mread32(mf);
	f->pantheon = mread32(mf);
	f->run = mread32(mf);
	f->warntype = mread32(mf);
	f->djinni_count = mread32(mf);
	f->ghost_count = mread32(mf);
	f->pickup_burden = mread32(mf);
	
	f->autodig = mread8(mf);
	f->autoquiver = mread8(mf);
	f->autounlock = mread8(mf);
	f->beginner = mread8(mf);
	f->debug = mread8(mf);
	f->explore = mread8(mf);
	f->tutorial = mread8(mf);
	f->female = mread8(mf);
	f->forcefight = mread8(mf);
	f->friday13 = mread8(mf);
	f->legacy = mread8(mf);
	f->lit_corridor = mread8(mf);
	f->made_amulet = mread8(mf);
	f->mon_moving = mread8(mf);
	f->move = mread8(mf);
	f->mv = mread8(mf);
	f->nopick = mread8(mf);
	f->pickup = mread8(mf);
	f->pushweapon = mread8(mf);
	f->rest_on_space = mread8(mf);
	f->safe_dog = mread8(mf);
	f->safe_peaceful = mread8(mf);
	f->silent = mread8(mf);
	f->sortpack = mread8(mf);
	f->soundok = mread8(mf);
	f->sparkle = mread8(mf);
	f->tombstone = mread8(mf);
	f->verbose = mread8(mf);
	f->prayconfirm = mread8(mf);
	f->travel = mread8(mf);
	f->end_disclose = mread8(mf);
	f->menu_style = mread8(mf);
	f->elbereth_enabled = mread8(mf);
	f->rogue_enabled = mread8(mf);
	f->seduce_enabled = mread8(mf);
	f->bones_enabled = mread8(mf);
	f->ascet = mread8(mf);
	f->atheist = mread8(mf);
	f->blindfolded = mread8(mf);
	f->illiterate = mread8(mf);
	f->pacifist = mread8(mf);
	f->nudist = mread8(mf);
	f->vegan = mread8(mf);
	f->vegetarian = mread8(mf);
	
	mread(mf, f->inv_order, sizeof(f->inv_order));
	mread(mf, f->spell_order, sizeof(f->spell_order));
}